

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void loop(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char (*pacVar4) [15];
  long lVar5;
  int x;
  int y;
  int z;
  char tmp [10000];
  int local_2754;
  int local_2750;
  char local_274c [4];
  undefined1 local_2748 [10008];
  
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          memset(buffer,0,10000);
          fgets(buffer,10000,_stdin);
          pcVar2 = strstr(buffer,"START");
          if (pcVar2 == (char *)0x0) break;
          memset(board,0,0xe1);
        }
        pcVar2 = strstr(buffer,"PLACE");
        if (pcVar2 == (char *)0x0) break;
        memset(local_2748,0,10000);
        __isoc99_sscanf(buffer,"%s %d %d %d",local_2748,&local_2754,&local_2750,local_274c);
        board[local_2754][local_2750] = local_274c[0];
      }
      pcVar2 = strstr(buffer,"DONE");
      if (pcVar2 == (char *)0x0) break;
      puts("OK");
LAB_00101540:
      fflush(_stdout);
    }
    pcVar2 = strstr(buffer,"BEGIN");
    if (pcVar2 != (char *)0x0) {
      if (board[1][0] == '\0') {
        iVar1 = 1;
        lVar5 = 0;
      }
      else {
        pacVar4 = board;
        lVar3 = 0;
        do {
          lVar5 = 0;
          do {
            if ((*pacVar4)[lVar5] == '\0') {
              iVar1 = (int)lVar3;
              goto LAB_00101520;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0xf);
          lVar3 = lVar3 + 1;
          pacVar4 = pacVar4 + 1;
        } while (lVar3 != 0xf);
        lVar5 = 0;
        iVar1 = 0;
      }
LAB_00101520:
      board[iVar1][lVar5] = '\x01';
      printf("%d %d\n");
      goto LAB_00101540;
    }
    pcVar2 = strstr(buffer,"TURN");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(buffer,"END");
      if (pcVar2 != (char *)0x0) {
        memset(local_2748,0,10000);
        __isoc99_sscanf(buffer,"%s %d",local_2748,&local_2754);
        return;
      }
    }
    else {
      memset(local_2748,0,10000);
      __isoc99_sscanf(buffer,"%s %d %d",local_2748,&local_2754,&local_2750);
      turn(local_2754,local_2750);
    }
  } while( true );
}

Assistant:

void loop() {
    while (TRUE) {
        memset(buffer, 0, sizeof(buffer));
        fgets(buffer, MAX_BYTE, stdin);

        if (strstr(buffer, START)) {
            start();
        } else if (strstr(buffer, PLACE)) {
            char tmp[MAX_BYTE] = {0};
            int x, y, z;
            sscanf(buffer, "%s %d %d %d", tmp, &x, &y, &z);
            place(x, y, (char) z);
        } else if (strstr(buffer, DONE)) {
            done();
        } else if (strstr(buffer, BEGIN)) {
            // AI
            struct Position pos = aiBegin((const char (*)[BOARD_SIZE]) board, ME);
            board[pos.x][pos.y] = ME;
            printf("%d %d\n", pos.x, pos.y);
            fflush(stdout);
        } else if (strstr(buffer, TURN)) {
            char tmp[MAX_BYTE] = {0};
            int x, y;
            sscanf(buffer, "%s %d %d", tmp, &x, &y);
            turn(x, y);
        } else if (strstr(buffer, END)) {
            char tmp[MAX_BYTE] = {0};
            int x;
            sscanf(buffer, "%s %d", tmp, &x);
            end(x);
            break;
        }
    }
}